

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O3

void arssort(string *strings,size_t scnt)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  list plVar4;
  int iVar5;
  uint uVar6;
  list __ptr;
  stack *psVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  list plVar11;
  long lVar12;
  uint uVar13;
  list plVar14;
  list plVar15;
  bucket_conflict1 *b;
  ulong uVar16;
  list plVar17;
  ulong uVar18;
  int used1 [256];
  uint local_838 [256];
  uint local_438 [258];
  
  __ptr = (list)calloc(scnt,0x18);
  if (scnt != 0) {
    uVar10 = 0;
    plVar17 = __ptr;
    do {
      plVar17->str = strings[uVar10];
      plVar11 = (list)0x0;
      if (uVar10 < scnt - 1) {
        plVar11 = plVar17 + 1;
      }
      plVar17->next = plVar11;
      uVar10 = uVar10 + 1;
      plVar17 = plVar17 + 1;
    } while (scnt != uVar10);
    plVar17 = __ptr;
    if (1 < (int)scnt) {
      uVar13 = (uint)((scnt & 0xffffffff) / 0x32);
      uVar6 = 1000;
      if (1000 < uVar13) {
        uVar6 = uVar13;
      }
      stackmem[0].blocksize = uVar6 * 0x18;
      stackmem[0].block[0] = malloc((ulong)(uint)stackmem[0].blocksize);
      stackmem[0].allocnr = 0;
      stackmem[0].nr = -1;
      stackmem[0].current = (void *)0x0;
      stackmem[0].first = (void *)0x0;
      plVar17 = (list)0x0;
      stackmem[0].last = (void *)0x0;
      psVar7 = (stack *)allocmem(stackmem,0x18);
      psVar7->head = __ptr;
      psVar7->tail = (list)0x0;
      psVar7->size = (int)scnt;
      psVar7->pos = 0;
      do {
        while( true ) {
          if (stackmem[0].first < stackmem[0].current) {
            stackmem[0].current = (void *)((long)stackmem[0].current + -0x18);
          }
          else {
            iVar2 = stackmem[0].nr;
            uVar6 = stackmem[0].nr - 1;
            stackmem[0].nr = uVar6;
            if (iVar2 < 1) {
              stackmem[0].current = (void *)0x0;
              stackmem[0].first = (void *)0x0;
              stackmem[0].last = (void *)0x0;
            }
            else {
              stackmem[0].first = stackmem[0].block[uVar6];
              stackmem[0].current =
                   (void *)((long)stackmem[0].first + (long)stackmem[0].blocksize + -0x18);
              stackmem[0].last = stackmem[0].current;
            }
          }
          pvVar3 = stackmem[0].current;
          stackp = (stack *)stackmem[0].current;
          if (psVar7->size == 0) break;
          plVar11 = psVar7->head;
          iVar2 = psVar7->pos;
          if (psVar7->size < 0x5dd) {
            uVar6 = (uint)plVar11->str[iVar2];
            if (plVar11->next == (list)0x0) {
              iVar5 = 1;
              uVar10 = 0;
              uVar13 = 0xff;
              plVar15 = plVar11;
            }
            else {
              uVar13 = 0xff;
              uVar10 = 0;
              iVar5 = 1;
              plVar4 = plVar11->next;
              plVar14 = plVar11;
              do {
                plVar15 = plVar4;
                bVar1 = plVar15->str[iVar2];
                if (uVar6 == bVar1) {
                  iVar5 = iVar5 + 1;
                }
                else {
                  lVar9 = (ulong)uVar6 * 0x18;
                  if ((&onebyte_b)[(ulong)uVar6 * 3] == 0) {
                    (&onebyte_b)[(ulong)uVar6 * 3] = (long)plVar11;
                    *(list *)(&DAT_00c193d8 + lVar9) = plVar14;
                    *(int *)(&DAT_00c193e0 + lVar9) = iVar5;
                    if (uVar6 != 0) {
                      if (uVar6 <= uVar13) {
                        uVar13 = uVar6;
                      }
                      if ((uint)uVar10 <= uVar6) {
                        uVar10 = (ulong)uVar6;
                      }
                    }
                  }
                  else {
                    *(list *)(*(long *)(&DAT_00c193d8 + lVar9) + 8) = plVar11;
                    *(list *)(&DAT_00c193d8 + lVar9) = plVar14;
                    *(int *)(&DAT_00c193e0 + lVar9) = *(int *)(&DAT_00c193e0 + lVar9) + iVar5;
                  }
                  iVar5 = 1;
                  plVar11 = plVar15;
                  uVar6 = (uint)bVar1;
                }
                plVar4 = plVar15->next;
                plVar14 = plVar15;
              } while (plVar15->next != (list)0x0);
            }
            lVar9 = (ulong)uVar6 * 0x18;
            if ((&onebyte_b)[(ulong)uVar6 * 3] == 0) {
              (&onebyte_b)[(ulong)uVar6 * 3] = (long)plVar11;
              *(list *)(&DAT_00c193d8 + lVar9) = plVar15;
              *(int *)(&DAT_00c193e0 + lVar9) = iVar5;
              if (uVar6 != 0) {
                if (uVar6 <= uVar13) {
                  uVar13 = uVar6;
                }
                if ((uint)uVar10 <= uVar6) {
                  uVar10 = (ulong)uVar6;
                }
              }
            }
            else {
              *(list *)(*(long *)(&DAT_00c193d8 + lVar9) + 8) = plVar11;
              *(list *)(&DAT_00c193d8 + lVar9) = plVar15;
              *(int *)(&DAT_00c193e0 + lVar9) = *(int *)(&DAT_00c193e0 + lVar9) + iVar5;
            }
            if (onebyte_b != 0) {
              _DAT_00c193e0 = 0;
              ontostack((bucket_conflict1 *)&onebyte_b,iVar2);
            }
            if (uVar13 <= (uint)uVar10) {
              b = (bucket_conflict1 *)(&onebyte_b + (ulong)uVar13 * 3);
              do {
                if (b->head != (list)0x0) {
                  ontostack(b,iVar2 + 1);
                }
                b = b + 1;
              } while (b <= (bucket_conflict1 *)(&onebyte_b + uVar10 * 3));
            }
          }
          else {
            uVar6 = 0;
            memset(local_838,0,0x400);
            memset(local_438,0,0x400);
            bVar1 = plVar11->str[iVar2];
            if (bVar1 != 0) {
              uVar6 = (uint)plVar11->str[(long)iVar2 + 1];
            }
            iVar5 = 1;
            plVar15 = plVar11;
            uVar6 = (uint)bVar1 << 8 | uVar6;
            for (plVar4 = plVar11->next; plVar4 != (list)0x0; plVar4 = plVar4->next) {
              bVar1 = plVar4->str[iVar2];
              if (bVar1 == 0) {
                uVar13 = 0;
              }
              else {
                uVar13 = (uint)plVar4->str[(long)iVar2 + 1];
              }
              uVar13 = (uint)bVar1 << 8 | uVar13;
              if (uVar13 == uVar6) {
                iVar5 = iVar5 + 1;
                uVar13 = uVar6;
              }
              else {
                lVar9 = (ulong)uVar6 * 0x18;
                if (*(long *)(twobytes_b + lVar9) == 0) {
                  *(list *)(twobytes_b + lVar9) = plVar11;
                  *(list *)(twobytes_b + lVar9 + 8) = plVar15;
                  *(int *)(twobytes_b + lVar9 + 0x10) = iVar5;
                  local_838[uVar6 & 0xff] = 1;
                  local_438[uVar6 >> 8] = 1;
                }
                else {
                  *(list *)(*(long *)(twobytes_b + lVar9 + 8) + 8) = plVar11;
                  *(list *)(twobytes_b + lVar9 + 8) = plVar15;
                  *(int *)(twobytes_b + lVar9 + 0x10) = *(int *)(twobytes_b + lVar9 + 0x10) + iVar5;
                }
                iVar5 = 1;
                plVar11 = plVar4;
              }
              plVar15 = plVar4;
              uVar6 = uVar13;
            }
            lVar9 = (ulong)uVar6 * 0x18;
            if (*(long *)(twobytes_b + lVar9) == 0) {
              *(list *)(twobytes_b + lVar9) = plVar11;
              *(list *)(twobytes_b + lVar9 + 8) = plVar15;
              *(int *)(twobytes_b + lVar9 + 0x10) = iVar5;
              local_838[uVar6 & 0xff] = 1;
              local_438[uVar6 >> 8] = 1;
            }
            else {
              *(list *)(*(long *)(twobytes_b + lVar9 + 8) + 8) = plVar11;
              *(list *)(twobytes_b + lVar9 + 8) = plVar15;
              *(int *)(twobytes_b + lVar9 + 0x10) = *(int *)(twobytes_b + lVar9 + 0x10) + iVar5;
            }
            lVar9 = 0;
            uVar10 = 0;
            uVar6 = 0;
            do {
              if (local_438[lVar9] != 0) {
                lVar12 = (long)(int)uVar6;
                uVar6 = uVar6 + 1;
                local_438[lVar12] = (uint)lVar9;
              }
              if (local_838[lVar9] != 0) {
                iVar5 = (int)uVar10;
                uVar10 = (ulong)(iVar5 + 1);
                local_838[iVar5] = (uint)lVar9;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x100);
            if (0 < (int)uVar6) {
              uVar18 = 0;
              do {
                if (0 < (int)uVar10) {
                  uVar13 = local_438[uVar18];
                  uVar16 = 0;
                  do {
                    lVar9 = (long)(int)(local_838[uVar16] | uVar13 << 8);
                    if (*(long *)(twobytes_b + lVar9 * 0x18) != 0) {
                      lVar9 = lVar9 * 0x18;
                      if ((char)local_838[uVar16] == '\0') {
                        *(undefined4 *)(twobytes_b + lVar9 + 0x10) = 0;
                      }
                      ontostack((bucket_conflict1 *)(twobytes_b + lVar9),iVar2 + 2);
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar10 != uVar16);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar6);
            }
          }
          psVar7 = stackp;
          if (stackp == (stack *)0x0) goto LAB_001e0b12;
        }
        psVar7->tail->next = plVar17;
        plVar17 = psVar7->head;
        psVar7 = (stack *)pvVar3;
      } while (pvVar3 != (void *)0x0);
LAB_001e0b12:
      freemem(stackmem);
      if (scnt == 0) goto LAB_001e0b42;
    }
    sVar8 = 0;
    do {
      strings[sVar8] = plVar17->str;
      sVar8 = sVar8 + 1;
      plVar17 = plVar17->next;
    } while (scnt != sVar8);
  }
LAB_001e0b42:
  free(__ptr);
  return;
}

Assistant:

void arssort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   int i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1]; 
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = MSD(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}